

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O0

char * utf8_iterate(char *buffer,size_t bufsize,int32_t *codepoint)

{
  size_t sVar1;
  uint local_34;
  int32_t *piStack_30;
  int32_t value;
  size_t count;
  int32_t *codepoint_local;
  size_t bufsize_local;
  char *buffer_local;
  
  buffer_local = buffer;
  if (bufsize != 0) {
    count = (size_t)codepoint;
    codepoint_local = (int32_t *)bufsize;
    bufsize_local = (size_t)buffer;
    piStack_30 = (int32_t *)utf8_check_first(*buffer);
    if (piStack_30 == (int32_t *)0x0) {
      buffer_local = (char *)0x0;
    }
    else {
      if (piStack_30 == (int32_t *)0x1) {
        local_34 = (uint)*(byte *)bufsize_local;
      }
      else if ((codepoint_local < piStack_30) ||
              (sVar1 = utf8_check_full((char *)bufsize_local,(size_t)piStack_30,(int32_t *)&local_34
                                      ), sVar1 == 0)) {
        return (char *)0x0;
      }
      if (count != 0) {
        *(uint *)count = local_34;
      }
      buffer_local = (char *)(bufsize_local + (long)piStack_30);
    }
  }
  return buffer_local;
}

Assistant:

const char *utf8_iterate(const char *buffer, size_t bufsize, int32_t *codepoint) {
    size_t count;
    int32_t value;

    if (!bufsize)
        return buffer;

    count = utf8_check_first(buffer[0]);
    if (count <= 0)
        return NULL;

    if (count == 1)
        value = (unsigned char) buffer[0];
    else {
        if (count > bufsize || !utf8_check_full(buffer, count, &value))
            return NULL;
    }

    if (codepoint)
        *codepoint = value;

    return buffer + count;
}